

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_1_channels_with_n_coeffs_mod0
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pfVar1 = output_buffer + output_sub_size;
  do {
    pfVar2 = decode_buffer + horizontal_contributors->n0;
    fVar7 = *pfVar2 * *horizontal_coefficients;
    fVar8 = pfVar2[1] * horizontal_coefficients[1];
    fVar9 = pfVar2[2] * horizontal_coefficients[2];
    fVar10 = pfVar2[3] * horizontal_coefficients[3];
    iVar5 = (horizontal_contributors->n1 - horizontal_contributors->n0 >> 2) + 1;
    lVar6 = 0x10;
    do {
      pfVar3 = (float *)((long)horizontal_coefficients + lVar6);
      pfVar4 = (float *)((long)pfVar2 + lVar6);
      fVar7 = fVar7 + *pfVar4 * *pfVar3;
      fVar8 = fVar8 + pfVar4[1] * pfVar3[1];
      fVar9 = fVar9 + pfVar4[2] * pfVar3[2];
      fVar10 = fVar10 + pfVar4[3] * pfVar3[3];
      lVar6 = lVar6 + 0x10;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
    *output_buffer = fVar10 + fVar8 + fVar9 + fVar7;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 1;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod0 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 4 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__store_output();
  } while ( output < output_end );
}